

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstroke.c
# Opt level: O0

FT_Error ft_stroker_arcto(FT_Stroker stroker,FT_Int side)

{
  FT_Fixed radius_00;
  FT_Error FVar1;
  long lVar2;
  FT_StrokeBorder border;
  FT_Error error;
  FT_Fixed radius;
  FT_Angle rotate;
  FT_Angle total;
  FT_Int side_local;
  FT_Stroker stroker_local;
  
  radius_00 = stroker->radius;
  lVar2 = (long)side * -0xb40000 + 0x5a0000;
  rotate = FT_Angle_Diff(stroker->angle_in,stroker->angle_out);
  if (rotate == 0xb40000) {
    rotate = lVar2 * -2;
  }
  FVar1 = ft_stroke_border_arcto
                    (stroker->borders + side,&stroker->center,radius_00,stroker->angle_in + lVar2,
                     rotate);
  stroker->borders[side].movable = '\0';
  return FVar1;
}

Assistant:

static FT_Error
  ft_stroker_arcto( FT_Stroker  stroker,
                    FT_Int      side )
  {
    FT_Angle         total, rotate;
    FT_Fixed         radius = stroker->radius;
    FT_Error         error  = FT_Err_Ok;
    FT_StrokeBorder  border = stroker->borders + side;


    rotate = FT_SIDE_TO_ROTATE( side );

    total = FT_Angle_Diff( stroker->angle_in, stroker->angle_out );
    if ( total == FT_ANGLE_PI )
      total = -rotate * 2;

    error = ft_stroke_border_arcto( border,
                                    &stroker->center,
                                    radius,
                                    stroker->angle_in + rotate,
                                    total );
    border->movable = FALSE;
    return error;
  }